

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O3

bool __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::validate<false>
          (InputParameter<3UL,_ruckig::StandardVector> *this,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  size_t sVar6;
  bool bVar7;
  optional<std::array<ruckig::ControlInterface,_3UL>_> *poVar8;
  long lVar9;
  optional<std::array<ruckig::ControlInterface,_3UL>_> *poVar10;
  size_t sVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  
  sVar6 = this->degrees_of_freedom;
  if (sVar6 != 0) {
    poVar10 = &this->per_dof_control_interface;
    sVar11 = 0;
    do {
      dVar1 = (this->max_jerk)._M_elems[sVar11];
      if ((dVar1 < 0.0) || (dVar2 = (this->max_acceleration)._M_elems[sVar11], dVar2 < 0.0))
      goto LAB_00186eea;
      if (((this->min_acceleration).super__Optional_base<std::array<double,_3UL>,_true,_true>.
           _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged & 1U) == 0)
      {
        dVar13 = -dVar2;
      }
      else {
        dVar13 = *(double *)((long)(&this->max_jerk + 2) + sVar11 * 8 + 8);
      }
      if (((0.0 < dVar13) || (dVar3 = (this->current_acceleration)._M_elems[sVar11], NAN(dVar3))) ||
         (dVar4 = (this->target_acceleration)._M_elems[sVar11], NAN(dVar4))) goto LAB_00186eea;
      if (check_current_state_within_limits) {
        if (dVar2 < dVar3) {
          return false;
        }
        if (dVar3 < dVar13) {
          return false;
        }
      }
      if (check_target_state_within_limits) {
        if (dVar2 < dVar4) {
          return false;
        }
        if (dVar4 < dVar13) {
          return false;
        }
      }
      dVar2 = (this->current_velocity)._M_elems[sVar11];
      if ((NAN(dVar2)) || (dVar13 = (this->target_velocity)._M_elems[sVar11], NAN(dVar13)))
      goto LAB_00186eea;
      poVar8 = (optional<std::array<ruckig::ControlInterface,_3UL>_> *)&this->control_interface;
      if (((this->per_dof_control_interface).
           super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>._M_payload.
           super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>._M_engaged & 1U)
          != 0) {
        poVar8 = poVar10;
      }
      if ((poVar8->super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>).
          _M_payload.super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>.
          _M_payload._M_value._M_elems[0] == Position) {
        if (((NAN((this->current_position)._M_elems[sVar11])) ||
            (NAN((this->target_position)._M_elems[sVar11]))) ||
           (dVar5 = (this->max_velocity)._M_elems[sVar11], dVar5 < 0.0)) goto LAB_00186eea;
        if (((this->min_velocity).super__Optional_base<std::array<double,_3UL>,_true,_true>.
             _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged & 1U) == 0
           ) {
          dVar14 = -dVar5;
        }
        else {
          dVar14 = *(double *)
                    ((long)&(((optional<std::array<double,_3UL>_> *)(&this->max_jerk + 1))->
                            super__Optional_base<std::array<double,_3UL>,_true,_true>)._M_payload.
                            super__Optional_payload_base<std::array<double,_3UL>_>._M_payload +
                    sVar11 * 8);
        }
        if (0.0 < dVar14) goto LAB_00186eea;
        if (check_current_state_within_limits) {
          if (dVar5 < dVar2) {
            return false;
          }
          if (dVar2 < dVar14) {
            return false;
          }
        }
        if (check_target_state_within_limits) {
          if (dVar5 < dVar13) {
            return false;
          }
          if (dVar13 < dVar14) {
            return false;
          }
        }
        if (((check_current_state_within_limits) &&
            ((((0.0 < dVar1 && (0.0 < dVar3)) && (dVar5 < (dVar3 * dVar3) / (dVar1 + dVar1) + dVar2)
              ) || (((0.0 < dVar1 && (dVar3 < 0.0)) &&
                    (dVar2 - (dVar3 * dVar3) / (dVar1 + dVar1) < dVar14)))))) ||
           ((check_target_state_within_limits &&
            ((((0.0 < dVar1 && (dVar4 < 0.0)) &&
              (dVar5 < (dVar4 * dVar4) / (dVar1 + dVar1) + dVar13)) ||
             (((0.0 < dVar1 && (0.0 < dVar4)) &&
              (dVar13 - (dVar4 * dVar4) / (dVar1 + dVar1) < dVar14)))))))) goto LAB_00186eea;
      }
      sVar11 = sVar11 + 1;
      poVar10 = (optional<std::array<ruckig::ControlInterface,_3UL>_> *)
                ((poVar10->
                 super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>).
                 _M_payload.super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>
                 ._M_payload._M_value._M_elems + 1);
    } while (sVar6 != sVar11);
  }
  bVar7 = true;
  if ((((this->intermediate_positions).
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->intermediate_positions).
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) && (this->control_interface == Position)) &&
     ((bVar7 = false,
      (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
      super__Optional_payload_base<double>._M_engaged == false &&
      (this->duration_discretization == Continuous)))) {
    if (((this->per_dof_control_interface).
         super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>._M_payload.
         super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>._M_engaged ==
         false) &&
       ((this->per_dof_synchronization).
        super__Optional_base<std::array<ruckig::Synchronization,_3UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<ruckig::Synchronization,_3UL>_>._M_engaged == false)
       ) {
      bVar7 = true;
      if (sVar6 != 0) {
        lVar9 = 0;
        do {
          bVar12 = ABS((this->max_jerk)._M_elems[lVar9]) == INFINITY;
          bVar7 = !bVar12;
          if (bVar12) {
            return bVar7;
          }
          bVar12 = sVar6 - 1 != lVar9;
          lVar9 = lVar9 + 1;
        } while (bVar12);
      }
    }
    else {
LAB_00186eea:
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool validate(bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const double jMax = max_jerk[dof];
            if (std::isnan(jMax) || jMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum jerk limit " + std::to_string(jMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMax = max_acceleration[dof];
            if (std::isnan(aMax) || aMax < 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("maximum acceleration limit " + std::to_string(aMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                }
                return false;
            }

            const double aMin = min_acceleration ? min_acceleration.value()[dof] : -max_acceleration[dof];
            if (std::isnan(aMin) || aMin > 0.0) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("minimum acceleration limit " + std::to_string(aMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                }
                return false;
            }

            const double a0 = current_acceleration[dof];
            if (std::isnan(a0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double af = target_acceleration[dof];
            if (std::isnan(af)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            if (check_current_state_within_limits) {
                if (a0 > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (a0 < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current acceleration " + std::to_string(a0) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }
            if (check_target_state_within_limits) {
                if (af > aMax) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " exceeds its maximum acceleration limit " + std::to_string(aMax) + ".");
                    }
                    return false;
                }
                if (af < aMin) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target acceleration " + std::to_string(af) + " of DoF " + std::to_string(dof) + " undercuts its minimum acceleration limit " + std::to_string(aMin) + ".");
                    }
                    return false;
                }
            }

            const double v0 = current_velocity[dof];
            if (std::isnan(v0)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }
            const double vf = target_velocity[dof];
            if (std::isnan(vf)) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                }
                return false;
            }

            auto control_interface_ = per_dof_control_interface ? per_dof_control_interface.value()[dof] : control_interface;
            if (control_interface_ == ControlInterface::Position) {
                const double p0 = current_position[dof];
                if (std::isnan(p0)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("current position " + std::to_string(p0) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }
                const double pf = target_position[dof];
                if (std::isnan(pf)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("target position " + std::to_string(pf) + " of DoF " + std::to_string(dof) + " should be a valid number.");
                    }
                    return false;
                }

                const double vMax = max_velocity[dof];
                if (std::isnan(vMax) || vMax < 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("maximum velocity limit " + std::to_string(vMax) + " of DoF " + std::to_string(dof) + " should be larger than or equal to zero.");
                    }
                    return false;
                }

                const double vMin = min_velocity ? min_velocity.value()[dof] : -max_velocity[dof];
                if (std::isnan(vMin) || vMin > 0.0) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("minimum velocity limit " + std::to_string(vMin) + " of DoF " + std::to_string(dof) + " should be smaller than or equal to zero.");
                    }
                    return false;
                }

                if (check_current_state_within_limits) {
                    if (v0 > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (v0 < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("current velocity " + std::to_string(v0) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (vf > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " exceeds its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (vf < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("target velocity " + std::to_string(vf) + " of DoF " + std::to_string(dof) + " undercuts its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }

                if (check_current_state_within_limits) {
                    if (a0 > 0 && jMax > 0 && v_at_a_zero(v0, a0, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, jMax)) + " from the current kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (a0 < 0 && jMax > 0 && v_at_a_zero(v0, a0, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably reach a velocity " + std::to_string(v_at_a_zero(v0, a0, -jMax)) + " from the current kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
                if (check_target_state_within_limits) {
                    if (af < 0 && jMax > 0 && v_at_a_zero(vf, af, jMax) > vMax) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, jMax)) + " from the target kinematic state that will exceed its maximum velocity limit " + std::to_string(vMax) + ".");
                        }
                        return false;
                    }
                    if (af > 0 && jMax > 0 && v_at_a_zero(vf, af, -jMax) < vMin) {
                        if constexpr (throw_validation_error) {
                            throw RuckigError("DoF " + std::to_string(dof) + " will inevitably have reached a velocity " + std::to_string(v_at_a_zero(vf, af, -jMax)) + " from the target kinematic state that will undercut its minimum velocity limit " + std::to_string(vMin) + ".");
                        }
                        return false;
                    }
                }
            }
        }

        if (!intermediate_positions.empty() && control_interface == ControlInterface::Position) {
            if (minimum_duration || duration_discretization != DurationDiscretization::Continuous) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate position can not be used together with a global minimum or discrete duration.");
                }
                return false;
            }

            if (per_dof_control_interface || per_dof_synchronization) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("Intermediate positions can only be used together with the position control interface and a global synchronization.");
                }
                return false;
            }

            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                const double jMax = max_jerk[dof];
                if (std::isinf(jMax)) {
                    if constexpr (throw_validation_error) {
                        throw RuckigError("infinite jerk limit of DoF " + std::to_string(dof) + " is currently not supported with intermediate positions.");
                    }
                    return false;
                }
            }
        }

        return true;
    }